

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O0

void RescalerExportRowShrink_SSE2(WebPRescaler *wrk)

{
  int iVar1;
  long lVar2;
  long in_RDI;
  int v_1;
  __m128i A3_1;
  __m128i A2_1;
  __m128i A1_1;
  __m128i A0_1;
  __m128i zero;
  __m128i mult;
  uint32_t scale;
  int v;
  uint32_t frac;
  __m128i G1;
  __m128i G0;
  __m128i F3;
  __m128i F2;
  __m128i E3;
  __m128i E2;
  __m128i E1;
  __m128i E0;
  __m128i D3;
  __m128i D2;
  __m128i D1;
  __m128i D0;
  __m128i B3;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i A3;
  __m128i A2;
  __m128i A1;
  __m128i A0;
  __m128i mult_y;
  __m128i mult_xy;
  int scale_xy;
  uint32_t yscale;
  rescaler_t *frow;
  int x_out_max;
  rescaler_t *irow;
  uint8_t *dst;
  int x_out;
  undefined1 local_494;
  undefined1 local_490;
  longlong local_488 [2];
  longlong local_478 [2];
  longlong local_468 [2];
  longlong local_458 [2];
  undefined8 local_448;
  undefined8 uStackY_440;
  ulong local_438;
  ulong uStackY_430;
  uint local_424;
  ulong local_418;
  ulong uStackY_410;
  ulong local_408;
  uint8_t *in_stack_fffffffffffffc00;
  __m128i *in_stack_fffffffffffffc08;
  __m128i *in_stack_fffffffffffffc10;
  __m128i *in_stack_fffffffffffffc18;
  __m128i *in_stack_fffffffffffffc20;
  __m128i *in_stack_fffffffffffffc28;
  ulong local_358;
  ulong uStack_350;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  long local_318;
  longlong lStack_310;
  longlong local_308;
  longlong lStack_300;
  longlong local_2f8;
  longlong lStack_2f0;
  longlong local_2e8;
  longlong lStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  uint local_2b0;
  uint local_2ac;
  long local_2a8;
  int local_29c;
  long local_298;
  long local_290;
  int local_284;
  long local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_240;
  ulong local_238;
  ulong uStack_230;
  ulong *local_220;
  ulong local_218;
  uint8_t *puStack_210;
  ulong *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  uint local_1d8;
  undefined4 local_1d4;
  uint local_1d0;
  undefined4 local_1cc;
  ulong local_1c8;
  ulong uStack_1c0;
  uint local_1b8;
  undefined4 local_1b4;
  uint local_1b0;
  undefined4 local_1ac;
  ulong local_1a8;
  ulong uStack_1a0;
  uint local_18c;
  undefined4 local_188;
  uint local_184;
  undefined4 local_180;
  undefined4 local_17c;
  ulong local_178;
  ulong uStack_170;
  undefined4 local_15c;
  ulong local_158;
  ulong uStack_150;
  undefined4 local_13c;
  ulong local_138;
  ulong uStack_130;
  undefined4 local_11c;
  ulong local_118;
  ulong uStack_110;
  __m128i *local_108;
  __m128i *palStack_100;
  ulong local_f8;
  ulong uStack_f0;
  __m128i *local_e8;
  __m128i *palStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  __m128i *palStack_c0;
  long local_b8;
  longlong lStack_b0;
  ulong local_a8;
  __m128i *palStack_a0;
  longlong local_98;
  longlong lStack_90;
  ulong local_88;
  ulong uStack_80;
  longlong local_78;
  longlong lStack_70;
  ulong local_68;
  ulong uStack_60;
  longlong local_58;
  longlong lStack_50;
  undefined4 local_3c;
  ulong local_38;
  __m128i *palStack_30;
  undefined4 local_1c;
  ulong local_18;
  __m128i *palStack_10;
  
  local_290 = *(long *)(in_RDI + 0x48);
  local_298 = *(long *)(in_RDI + 0x58);
  local_29c = *(int *)(in_RDI + 0x34) * *(int *)(in_RDI + 8);
  local_2a8 = *(long *)(in_RDI + 0x60);
  local_2ac = *(int *)(in_RDI + 0x10) * -*(int *)(in_RDI + 0x18);
  if (local_2ac == 0) {
    local_424 = *(uint *)(in_RDI + 0x14);
    local_1cc = 0;
    local_1d4 = 0;
    local_438 = (ulong)local_424;
    uStackY_430 = (ulong)local_424;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_448 = 0;
    uStackY_440 = 0;
    local_2ac = 0;
    local_1e8 = local_438;
    uStack_1e0 = uStackY_430;
    local_1d8 = local_424;
    local_1d0 = local_424;
    for (local_284 = 0; local_284 + 8 <= local_29c; local_284 = local_284 + 8) {
      LoadDispatchAndMult_SSE2
                ((rescaler_t *)(local_298 + (long)local_284 * 4),(__m128i *)0x0,&local_458,
                 &local_468,&local_478,&local_488);
      local_240 = (undefined8 *)(local_298 + (long)local_284 * 4);
      local_258 = local_448;
      uStack_250 = uStackY_440;
      *local_240 = local_448;
      local_240[1] = uStackY_440;
      lVar2 = local_298 + (long)local_284 * 4;
      local_260 = (undefined8 *)(lVar2 + 0x10);
      local_278 = local_448;
      uStack_270 = uStackY_440;
      *local_260 = local_448;
      *(undefined8 *)(lVar2 + 0x18) = uStackY_440;
      ProcessRow_SSE2(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                      in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00)
      ;
    }
    for (; local_284 < local_29c; local_284 = local_284 + 1) {
      lVar2 = (ulong)*(uint *)(local_298 + (long)local_284 * 4) * (ulong)local_424 + 0x80000000;
      if ((int)((ulong)lVar2 >> 0x20) < 0x100) {
        local_494 = (undefined1)((ulong)lVar2 >> 0x20);
      }
      else {
        local_494 = 0xff;
      }
      *(undefined1 *)(local_290 + local_284) = local_494;
      *(undefined4 *)(local_298 + (long)local_284 * 4) = 0;
    }
  }
  else {
    local_2b0 = *(uint *)(in_RDI + 0x14);
    local_180 = 0;
    local_188 = 0;
    local_2c8 = (ulong)local_2b0;
    uStack_2c0 = (ulong)local_2b0;
    local_1ac = 0;
    local_1b4 = 0;
    local_2d8 = (ulong)local_2ac;
    uStack_2d0 = (ulong)local_2ac;
    local_280 = in_RDI;
    local_1c8 = local_2d8;
    uStack_1c0 = uStack_2d0;
    local_1b8 = local_2ac;
    local_1b0 = local_2ac;
    local_1a8 = local_2c8;
    uStack_1a0 = uStack_2c0;
    local_18c = local_2b0;
    local_184 = local_2b0;
    for (local_284 = 0; local_284 + 8 <= local_29c; local_284 = local_284 + 8) {
      LoadDispatchAndMult_SSE2
                ((rescaler_t *)(local_298 + (long)local_284 * 4),(__m128i *)0x0,
                 (__m128i *)&local_2e8,(__m128i *)&local_2f8,(__m128i *)&local_308,
                 (__m128i *)&local_318);
      LoadDispatchAndMult_SSE2
                ((rescaler_t *)(local_2a8 + (long)local_284 * 4),(__m128i *)&local_2d8,
                 (__m128i *)&local_328,(__m128i *)&local_338,(__m128i *)&local_348,
                 (__m128i *)&local_358);
      local_118 = local_328;
      uStack_110 = uStack_320;
      local_11c = 0x20;
      local_d8 = local_328 >> 0x20;
      uStack_d0 = uStack_320 >> 0x20;
      local_138 = local_338;
      uStack_130 = uStack_330;
      local_13c = 0x20;
      local_f8 = local_338 >> 0x20;
      uStack_f0 = uStack_330 >> 0x20;
      local_158 = local_348;
      uStack_150 = uStack_340;
      local_15c = 0x20;
      local_a8 = local_348 >> 0x20;
      palStack_e0 = (__m128i *)(uStack_340 >> 0x20);
      local_178 = local_358;
      uStack_170 = uStack_350;
      local_17c = 0x20;
      local_c8 = local_358 >> 0x20;
      palStack_100 = (__m128i *)(uStack_350 >> 0x20);
      local_58 = local_2e8;
      lStack_50 = lStack_2e0;
      local_78 = local_2f8;
      lStack_70 = lStack_2f0;
      local_98 = local_308;
      lStack_90 = lStack_300;
      local_b8 = local_318;
      lStack_b0 = lStack_310;
      local_1c = 0x20;
      local_e8 = (__m128i *)(local_a8 << 0x20);
      local_3c = 0x20;
      local_108 = (__m128i *)(local_c8 << 0x20);
      local_408 = local_d8 | (ulong)local_e8;
      puStack_210 = (uint8_t *)((uStack_320 | uStack_340) >> 0x20);
      local_418 = local_f8 | (ulong)local_108;
      uStackY_410 = (uStack_330 | uStack_350) >> 0x20;
      local_200 = (ulong *)(local_298 + (long)local_284 * 4);
      *local_200 = local_408;
      local_200[1] = (ulong)puStack_210;
      lVar2 = local_298 + (long)local_284 * 4;
      local_220 = (ulong *)(lVar2 + 0x10);
      *local_220 = local_418;
      *(ulong *)(lVar2 + 0x18) = uStackY_410;
      local_238 = local_418;
      uStack_230 = uStackY_410;
      local_218 = local_408;
      palStack_c0 = palStack_100;
      palStack_a0 = palStack_e0;
      local_88 = local_f8;
      uStack_80 = uStack_f0;
      local_68 = local_d8;
      uStack_60 = uStack_d0;
      local_38 = local_c8;
      palStack_30 = palStack_100;
      local_18 = local_a8;
      palStack_10 = palStack_e0;
      ProcessRow_SSE2((__m128i *)(local_318 - local_c8),palStack_e0,local_e8,palStack_100,local_108,
                      puStack_210);
    }
    for (; local_284 < local_29c; local_284 = local_284 + 1) {
      iVar1 = (int)((ulong)*(uint *)(local_2a8 + (long)local_284 * 4) * (ulong)local_2ac >> 0x20);
      lVar2 = (ulong)(uint)(*(int *)(local_298 + (long)local_284 * 4) - iVar1) *
              (ulong)*(uint *)(local_280 + 0x14) + 0x80000000;
      if ((int)((ulong)lVar2 >> 0x20) < 0x100) {
        local_490 = (undefined1)((ulong)lVar2 >> 0x20);
      }
      else {
        local_490 = 0xff;
      }
      *(undefined1 *)(local_290 + local_284) = local_490;
      *(int *)(local_298 + (long)local_284 * 4) = iVar1;
    }
  }
  return;
}

Assistant:

static void RescalerExportRowShrink_SSE2(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  const uint32_t yscale = wrk->fy_scale * (-wrk->y_accum);
  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0);
  assert(!wrk->y_expand);
  if (yscale) {
    const int scale_xy = wrk->fxy_scale;
    const __m128i mult_xy = _mm_set_epi32(0, scale_xy, 0, scale_xy);
    const __m128i mult_y = _mm_set_epi32(0, yscale, 0, yscale);
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3, B0, B1, B2, B3;
      LoadDispatchAndMult_SSE2(irow + x_out, NULL, &A0, &A1, &A2, &A3);
      LoadDispatchAndMult_SSE2(frow + x_out, &mult_y, &B0, &B1, &B2, &B3);
      {
        const __m128i D0 = _mm_srli_epi64(B0, WEBP_RESCALER_RFIX);   // = frac
        const __m128i D1 = _mm_srli_epi64(B1, WEBP_RESCALER_RFIX);
        const __m128i D2 = _mm_srli_epi64(B2, WEBP_RESCALER_RFIX);
        const __m128i D3 = _mm_srli_epi64(B3, WEBP_RESCALER_RFIX);
        const __m128i E0 = _mm_sub_epi64(A0, D0);   // irow[x] - frac
        const __m128i E1 = _mm_sub_epi64(A1, D1);
        const __m128i E2 = _mm_sub_epi64(A2, D2);
        const __m128i E3 = _mm_sub_epi64(A3, D3);
        const __m128i F2 = _mm_slli_epi64(D2, 32);
        const __m128i F3 = _mm_slli_epi64(D3, 32);
        const __m128i G0 = _mm_or_si128(D0, F2);
        const __m128i G1 = _mm_or_si128(D1, F3);
        _mm_storeu_si128((__m128i*)(irow + x_out + 0), G0);
        _mm_storeu_si128((__m128i*)(irow + x_out + 4), G1);
        ProcessRow_SSE2(&E0, &E1, &E2, &E3, &mult_xy, dst + x_out);
      }
    }
    for (; x_out < x_out_max; ++x_out) {
      const uint32_t frac = (int)MULT_FIX_FLOOR(frow[x_out], yscale);
      const int v = (int)MULT_FIX(irow[x_out] - frac, wrk->fxy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = frac;   // new fractional start
    }
  } else {
    const uint32_t scale = wrk->fxy_scale;
    const __m128i mult = _mm_set_epi32(0, scale, 0, scale);
    const __m128i zero = _mm_setzero_si128();
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3;
      LoadDispatchAndMult_SSE2(irow + x_out, NULL, &A0, &A1, &A2, &A3);
      _mm_storeu_si128((__m128i*)(irow + x_out + 0), zero);
      _mm_storeu_si128((__m128i*)(irow + x_out + 4), zero);
      ProcessRow_SSE2(&A0, &A1, &A2, &A3, &mult, dst + x_out);
    }
    for (; x_out < x_out_max; ++x_out) {
      const int v = (int)MULT_FIX(irow[x_out], scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = 0;
    }
  }
}